

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fIntegerStateQueryTests.cpp
# Opt level: O0

void __thiscall
deqp::gles2::Functional::IntegerStateQueryVerifiers::GetBooleanVerifier::
verifyUnsignedIntegerGreaterOrEqual
          (GetBooleanVerifier *this,TestContext *testCtx,GLenum name,GLuint reference)

{
  GLenum pname;
  bool bVar1;
  qpTestResult qVar2;
  uchar *puVar3;
  TestLog *pTVar4;
  MessageBuilder *pMVar5;
  MessageBuilder local_338;
  MessageBuilder local_1a8;
  StateQueryMemoryWriteGuard<unsigned_char> local_23;
  GLuint local_20;
  GLenum GStack_1c;
  StateQueryMemoryWriteGuard<unsigned_char> state;
  GLuint reference_local;
  GLenum name_local;
  TestContext *testCtx_local;
  GetBooleanVerifier *this_local;
  
  local_20 = reference;
  GStack_1c = name;
  deqp::gls::StateQueryUtil::StateQueryMemoryWriteGuard<unsigned_char>::StateQueryMemoryWriteGuard
            (&local_23);
  pname = GStack_1c;
  puVar3 = deqp::gls::StateQueryUtil::StateQueryMemoryWriteGuard<unsigned_char>::operator&
                     (&local_23);
  glu::CallLogWrapper::glGetBooleanv(&(this->super_StateVerifier).super_CallLogWrapper,pname,puVar3)
  ;
  bVar1 = deqp::gls::StateQueryUtil::StateQueryMemoryWriteGuard<unsigned_char>::verifyValidity
                    (&local_23,testCtx);
  if ((bVar1) &&
     (puVar3 = deqp::gls::StateQueryUtil::StateQueryMemoryWriteGuard::
               operator_cast_to_unsigned_char_((StateQueryMemoryWriteGuard *)&local_23),
     *puVar3 != '\x01')) {
    puVar3 = deqp::gls::StateQueryUtil::StateQueryMemoryWriteGuard::operator_cast_to_unsigned_char_
                       ((StateQueryMemoryWriteGuard *)&local_23);
    if (*puVar3 == '\0') {
      if (local_20 != 0) {
        pTVar4 = tcu::TestContext::getLog(testCtx);
        tcu::TestLog::operator<<(&local_1a8,pTVar4,(BeginMessageToken *)&tcu::TestLog::Message);
        pMVar5 = tcu::MessageBuilder::operator<<
                           (&local_1a8,(char (*) [27])"// ERROR: expected GL_TRUE");
        tcu::MessageBuilder::operator<<(pMVar5,(EndMessageToken *)&tcu::TestLog::EndMessage);
        tcu::MessageBuilder::~MessageBuilder(&local_1a8);
        qVar2 = tcu::TestContext::getTestResult(testCtx);
        if (qVar2 == QP_TEST_RESULT_PASS) {
          tcu::TestContext::setTestResult(testCtx,QP_TEST_RESULT_FAIL,"Got invalid boolean value");
        }
      }
    }
    else {
      pTVar4 = tcu::TestContext::getLog(testCtx);
      tcu::TestLog::operator<<(&local_338,pTVar4,(BeginMessageToken *)&tcu::TestLog::Message);
      pMVar5 = tcu::MessageBuilder::operator<<
                         (&local_338,(char (*) [39])"// ERROR: expected GL_TRUE or GL_FALSE");
      tcu::MessageBuilder::operator<<(pMVar5,(EndMessageToken *)&tcu::TestLog::EndMessage);
      tcu::MessageBuilder::~MessageBuilder(&local_338);
      qVar2 = tcu::TestContext::getTestResult(testCtx);
      if (qVar2 == QP_TEST_RESULT_PASS) {
        tcu::TestContext::setTestResult(testCtx,QP_TEST_RESULT_FAIL,"Got invalid boolean value");
      }
    }
  }
  return;
}

Assistant:

void GetBooleanVerifier::verifyUnsignedIntegerGreaterOrEqual (tcu::TestContext& testCtx, GLenum name, GLuint reference)
{
	using tcu::TestLog;

	StateQueryMemoryWriteGuard<GLboolean> state;
	glGetBooleanv(name, &state);

	if (!state.verifyValidity(testCtx))
		return;

	if (state == GL_TRUE) // state is non-zero, could be greater than reference (correct)
		return;

	if (state == GL_FALSE) // state is zero
	{
		if (reference > 0) // and reference is greater than zero?
		{
			testCtx.getLog() << TestLog::Message << "// ERROR: expected GL_TRUE" << TestLog::EndMessage;
			if (testCtx.getTestResult() == QP_TEST_RESULT_PASS)
				testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Got invalid boolean value");
		}
	}
	else
	{
		testCtx.getLog() << TestLog::Message << "// ERROR: expected GL_TRUE or GL_FALSE" << TestLog::EndMessage;
		if (testCtx.getTestResult() == QP_TEST_RESULT_PASS)
			testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Got invalid boolean value");
	}
}